

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_pointer_based_iterator.cpp
# Opt level: O0

void __thiscall
PointerBasedIterator_Assign_Test::~PointerBasedIterator_Assign_Test
          (PointerBasedIterator_Assign_Test *this)

{
  PointerBasedIterator_Assign_Test *this_local;
  
  ~PointerBasedIterator_Assign_Test(this);
  ::operator_delete(this,0x10);
  return;
}

Assistant:

TEST_F (PointerBasedIterator, Assign) {
    std::array<int, 2> arr{{3, 5}};
    iterator b{&arr[0] + 2};
    iterator a{&arr[0]};
    b = a;
    EXPECT_EQ (b, a);

    std::array<int const, 2> const carr{{7, 11}};
    const_iterator c{&carr[0]};
    c = a;
    EXPECT_EQ (c, a);
}